

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_size_row_column_size_resize_Test::TestBody
          (test_matrix_dense_size_row_column_size_resize_Test *this)

{
  double *pdVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_438;
  Message local_430;
  int local_424;
  size_type local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_17;
  Vector_Dense<double,_0UL> *row_1;
  iterator __end1_1;
  iterator __begin1_1;
  Matrix_Dense<double,_0UL,_0UL> *__range1_1;
  Message local_3e0;
  int local_3d4;
  size_t local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_16;
  Message local_3b0;
  int local_3a4;
  size_t local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_15;
  Message local_380;
  int local_374;
  pair<unsigned_long,_unsigned_long> local_370;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_14;
  Message local_348;
  int local_33c;
  pair<unsigned_long,_unsigned_long> local_338;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_13;
  Message local_310;
  int local_304;
  size_type local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_12;
  Vector_Dense<double,_0UL> *row;
  iterator __end1;
  iterator __begin1;
  Matrix_Dense<double,_0UL,_0UL> *__range1;
  Message local_2c0;
  int local_2b4;
  size_t local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_11;
  Message local_290;
  int local_284;
  size_t local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_10;
  Message local_260;
  int local_254;
  pair<unsigned_long,_unsigned_long> local_250;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_9;
  Message local_228;
  int local_21c;
  pair<unsigned_long,_unsigned_long> local_218;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_8;
  Message local_1f0;
  int local_1e4;
  size_t local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_7;
  Message local_1c0;
  int local_1b4;
  size_t local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_6;
  Message local_190;
  int local_184;
  size_t local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_5;
  Message local_160;
  int local_154;
  size_t local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  Message local_130;
  int local_124;
  pair<unsigned_long,_unsigned_long> local_120;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  int local_ec;
  pair<unsigned_long,_unsigned_long> local_e8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  int local_b4;
  pair<unsigned_long,_unsigned_long> local_b0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88;
  int local_7c;
  pair<unsigned_long,_unsigned_long> local_78;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  undefined1 local_48 [8];
  Matrix_Dense<double,_2UL,_2UL> static_matrix;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix;
  test_matrix_dense_size_row_column_size_resize_Test *this_local;
  
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)
             (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
              super_array<double,_2UL>._M_elems + 1));
  Disa::Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense((Matrix_Dense<double,_2UL,_2UL> *)local_48);
  local_78 = Disa::Matrix_Dense<double,_0UL,_0UL>::size
                       ((Matrix_Dense<double,_0UL,_0UL> *)
                        (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1]
                         .super_array<double,_2UL>._M_elems + 1));
  local_7c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_68,"dynamic_matrix.size().first","0",&local_78.first,&local_7c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_b0 = Disa::Matrix_Dense<double,_0UL,_0UL>::size
                       ((Matrix_Dense<double,_0UL,_0UL> *)
                        (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1]
                         .super_array<double,_2UL>._M_elems + 1));
  local_b4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a0,"dynamic_matrix.size().second","0",&local_b0.second,&local_b4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_e8 = Disa::Matrix_Dense<double,_2UL,_2UL>::size((Matrix_Dense<double,_2UL,_2UL> *)local_48);
  local_ec = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d8,"static_matrix.size().first","2",&local_e8.first,&local_ec);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_120 = Disa::Matrix_Dense<double,_2UL,_2UL>::size((Matrix_Dense<double,_2UL,_2UL> *)local_48)
  ;
  local_124 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_110,"static_matrix.size().second","2",&local_120.second,&local_124);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_150 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_row
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_154 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_148,"dynamic_matrix.size_row()","0",&local_150,&local_154);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_180 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_column
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_184 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_178,"dynamic_matrix.size_column()","0",&local_180,&local_184);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar2) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1b0 = Disa::Matrix_Dense<double,_2UL,_2UL>::size_row
                        ((Matrix_Dense<double,_2UL,_2UL> *)local_48);
  local_1b4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1a8,"static_matrix.size_row()","2",&local_1b0,&local_1b4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1e0 = Disa::Matrix_Dense<double,_2UL,_2UL>::size_column
                        ((Matrix_Dense<double,_2UL,_2UL> *)local_48);
  local_1e4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1d8,"static_matrix.size_column()","2",&local_1e0,&local_1e4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  resize((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
          *)(static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
             super_array<double,_2UL>._M_elems + 1),1);
  local_218 = Disa::Matrix_Dense<double,_0UL,_0UL>::size
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_21c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_208,"dynamic_matrix.size().first","1",&local_218.first,&local_21c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_250 = Disa::Matrix_Dense<double,_0UL,_0UL>::size
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_254 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_240,"dynamic_matrix.size().second","0",&local_250.second,&local_254);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar2) {
    testing::Message::Message(&local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_280 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_row
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_284 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_278,"dynamic_matrix.size_row()","1",&local_280,&local_284);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_2b0 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_column
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_2b4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2a8,"dynamic_matrix.size_column()","0",&local_2b0,&local_2b4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  pdVar1 = static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
           super_array<double,_2UL>._M_elems + 1;
  __end1 = std::
           vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ::begin((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    *)pdVar1);
  row = (Vector_Dense<double,_0UL> *)
        std::
        vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
        end((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             *)pdVar1);
  while (bVar2 = __gnu_cxx::
                 operator==<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
                           (&__end1,(__normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
                                     *)&row), ((bVar2 ^ 0xffU) & 1) != 0) {
    gtest_ar_12.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
           ::operator*(&__end1);
    local_300 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           gtest_ar_12.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    local_304 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_2f8,"row.size()","0",&local_300,&local_304);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
    if (!bVar2) {
      testing::Message::Message(&local_310);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                 ,0x67,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_310);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_310);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
    __gnu_cxx::
    __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
    ::operator++(&__end1);
  }
  Disa::Matrix_Dense<double,_0UL,_0UL>::resize
            ((Matrix_Dense<double,_0UL,_0UL> *)
             (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
              super_array<double,_2UL>._M_elems + 1),3,2);
  local_338 = Disa::Matrix_Dense<double,_0UL,_0UL>::size
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_33c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_328,"dynamic_matrix.size().first","3",&local_338.first,&local_33c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar2) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_370 = Disa::Matrix_Dense<double,_0UL,_0UL>::size
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_374 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_360,"dynamic_matrix.size().second","2",&local_370.second,&local_374);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar2) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_3a0 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_row
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_3a4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_398,"dynamic_matrix.size_row()","3",&local_3a0,&local_3a4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar2) {
    testing::Message::Message(&local_3b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3d0 = Disa::Matrix_Dense<double,_0UL,_0UL>::size_column
                        ((Matrix_Dense<double,_0UL,_0UL> *)
                         (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems
                          [1].super_array<double,_2UL>._M_elems + 1));
  local_3d4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3c8,"dynamic_matrix.size_column()","2",&local_3d0,&local_3d4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_1,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_1);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  pdVar1 = static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
           super_array<double,_2UL>._M_elems + 1;
  __end1_1 = std::
             vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ::begin((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                      *)pdVar1);
  row_1 = (Vector_Dense<double,_0UL> *)
          std::
          vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
          ::end((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 *)pdVar1);
  while (bVar2 = __gnu_cxx::
                 operator==<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
                           (&__end1_1,
                            (__normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
                             *)&row_1), ((bVar2 ^ 0xffU) & 1) != 0) {
    gtest_ar_17.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
           ::operator*(&__end1_1);
    local_420 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           gtest_ar_17.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    local_424 = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_418,"row.size()","2",&local_420,&local_424);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
    if (!bVar2) {
      testing::Message::Message(&local_430);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
      testing::internal::AssertHelper::AssertHelper
                (&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
                 ,0x6e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_438,&local_430);
      testing::internal::AssertHelper::~AssertHelper(&local_438);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
    __gnu_cxx::
    __normal_iterator<Disa::Vector_Dense<double,_0UL>_*,_std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>_>
    ::operator++(&__end1_1);
  }
  Disa::Matrix_Dense<double,_0UL,_0UL>::~Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)
             (static_matrix.super_array<Disa::Vector_Dense<double,_2UL>,_2UL>._M_elems[1].
              super_array<double,_2UL>._M_elems + 1));
  return;
}

Assistant:

TEST(test_matrix_dense, size_row_column_size_resize) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix;
  Matrix_Dense<Scalar, 2, 2> static_matrix;

  EXPECT_EQ(dynamic_matrix.size().first, 0);
  EXPECT_EQ(dynamic_matrix.size().second, 0);
  EXPECT_EQ(static_matrix.size().first, 2);
  EXPECT_EQ(static_matrix.size().second, 2);

  EXPECT_EQ(dynamic_matrix.size_row(), 0);
  EXPECT_EQ(dynamic_matrix.size_column(), 0);
  EXPECT_EQ(static_matrix.size_row(), 2);
  EXPECT_EQ(static_matrix.size_column(), 2);

  dynamic_matrix.resize(1);
  EXPECT_EQ(dynamic_matrix.size().first, 1);
  EXPECT_EQ(dynamic_matrix.size().second, 0);
  EXPECT_EQ(dynamic_matrix.size_row(), 1);
  EXPECT_EQ(dynamic_matrix.size_column(), 0);
  FOR_EACH(row, dynamic_matrix) EXPECT_EQ(row.size(), 0);

  dynamic_matrix.resize(3, 2);
  EXPECT_EQ(dynamic_matrix.size().first, 3);
  EXPECT_EQ(dynamic_matrix.size().second, 2);
  EXPECT_EQ(dynamic_matrix.size_row(), 3);
  EXPECT_EQ(dynamic_matrix.size_column(), 2);
  FOR_EACH(row, dynamic_matrix) EXPECT_EQ(row.size(), 2);
}